

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

string * __thiscall
ast::FunctionLiteral::toString_abi_cxx11_(string *__return_storage_ptr__,FunctionLiteral *this)

{
  long lVar1;
  ostringstream msg;
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"define ",7);
  if (this->header != (Identifier *)0x0) {
    ast::operator<<((ostream *)local_1a0,this->header);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
  if (0 < (int)((ulong)((long)(this->parameters).
                              super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->parameters).
                             super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar1 = 0;
    do {
      if (lVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", ",2);
      }
      ast::operator<<((ostream *)local_1a0,
                      (this->parameters).
                      super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (int)((ulong)((long)(this->parameters).
                                         super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->parameters).
                                        super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,")",1);
  ast::operator<<((ostream *)local_1a0,this->body);
  std::ios::widen((char)(ostream *)local_1a0 + (char)*(undefined8 *)(local_1a0[0] + -0x18));
  std::ostream::put((char)local_1a0);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::FunctionLiteral::toString() const
{
    std::ostringstream msg;
    msg << "define ";
    if(header != nullptr){
        msg << header;
    }
    msg << "(";
    for(int i{0}; i < (int)parameters.size(); i++){
        if(i > 0 && i+1 <= (int)parameters.size()){
            msg << ", ";
        }
        msg << parameters[i];
    }
    msg << ")";
    msg << body;
    msg << std::endl;
    return msg.str();
}